

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsPrefixTest.cpp
# Opt level: O2

bool __thiscall
DnsPrefixTest::DoOneTest(DnsPrefixTest *this,DnsStats *stats,char *test_input,char *expected)

{
  int iVar1;
  char *pcVar2;
  char *__s2;
  char teu [256];
  char tiu [256];
  char acStack_228 [256];
  char local_128 [256];
  
  pcVar2 = ToUpper(this,test_input,local_128,0x100);
  __s2 = ToUpper(this,expected,acStack_228,0x100);
  pcVar2 = DnsStats::GetZonePrefix(stats,pcVar2);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = "NULL";
    if (__s2 == (char *)0x0) {
      return true;
    }
  }
  else if ((__s2 != (char *)0x0) && (iVar1 = strcmp(pcVar2,__s2), iVar1 == 0)) {
    return true;
  }
  if (test_input == (char *)0x0) {
    test_input = "NULL";
  }
  if (__s2 == (char *)0x0) {
    __s2 = "NULL";
  }
  TEST_LOG("DnsPrefixTest fails for input <%s>, expected <%s>, got <%s>\n",test_input,__s2,pcVar2);
  return false;
}

Assistant:

bool DnsPrefixTest::DoOneTest(DnsStats * stats, char const * test_input, char const * expected)
{
    bool ret = true;
    char tiu[256];
    char teu[256];
    char * ti;
    char * te;
    const char * tr;

    ti = ToUpper(test_input, tiu, sizeof(tiu));
    te = ToUpper(expected, teu, sizeof(teu));

    tr = stats->GetZonePrefix(ti);

    if (tr == NULL) {
        if (te != NULL) {
            ret = false;
        }
    } else if (te == NULL) {
        ret = false;
    } else if (strcmp(tr, te) != 0) {
        ret = false;
    }

    if (!ret) {
        TEST_LOG("DnsPrefixTest fails for input <%s>, expected <%s>, got <%s>\n",
            (test_input == NULL) ? "NULL" : test_input,
            (te == NULL) ? "NULL" : te,
            (tr == NULL) ? "NULL" : tr);
    }
    return ret;
}